

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerReflection::to_member_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerReflection *this,SPIRType *type,uint32_t index)

{
  Decoration *pDVar1;
  size_type sVar2;
  pointer pcVar3;
  Meta *pMVar4;
  undefined4 in_register_0000000c;
  uint *puVar5;
  uint *ts_1;
  char local_14 [4];
  
  ts_1 = (uint *)CONCAT44(in_register_0000000c,index);
  pMVar4 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,
                               (ID)(type->super_IVariant).self.id);
  if ((pMVar4 != (Meta *)0x0) &&
     (puVar5 = (uint *)(ulong)index, ts_1 = puVar5,
     puVar5 < (uint *)(pMVar4->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size)
     ) {
    pDVar1 = (pMVar4->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    ts_1 = (uint *)((long)puVar5 * 0x188);
    sVar2 = pDVar1[(long)puVar5].alias._M_string_length;
    if (sVar2 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = pDVar1[(long)puVar5].alias._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
      return __return_storage_ptr__;
    }
  }
  join<char_const(&)[3],unsigned_int&>
            (__return_storage_ptr__,(spirv_cross *)0x376efe,(char (*) [3])local_14,ts_1);
  return __return_storage_ptr__;
}

Assistant:

string CompilerReflection::to_member_name(const SPIRType &type, uint32_t index) const
{
	auto *type_meta = ir.find_meta(type.self);

	if (type_meta)
	{
		auto &memb = type_meta->members;
		if (index < memb.size() && !memb[index].alias.empty())
			return memb[index].alias;
		else
			return join("_m", index);
	}
	else
		return join("_m", index);
}